

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  int *piVar28;
  float *pfVar29;
  float *pfVar30;
  int iVar31;
  float *partials1;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  pfVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[parIndex];
  pfVar26 = (this->super_BeagleCPUImpl<float,_1,_0>).gTransitionMatrices[probIndex];
  pfVar27 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  memset((this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<float,_1,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount * 4);
  if ((childIndex < (this->super_BeagleCPUImpl<float,_1,_0>).kTipCount) &&
     (piVar28 = (this->super_BeagleCPUImpl<float,_1,_0>).gTipStates[childIndex],
     piVar28 != (int *)0x0)) {
    uVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    iVar31 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
    uVar23 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    iVar35 = 0;
    iVar36 = 0;
    for (uVar34 = 0; uVar34 != (~((int)uVar22 >> 0x1f) & uVar22); uVar34 = uVar34 + 1) {
      pfVar29 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      fVar1 = pfVar27[uVar34];
      for (lVar37 = 0; (ulong)(~((int)uVar23 >> 0x1f) & uVar23) << 2 != lVar37; lVar37 = lVar37 + 4)
      {
        iVar24 = *(int *)((long)piVar28 + lVar37);
        auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar26[iVar24 + iVar35] * pfVar25[iVar36 + lVar37]
                                                )),ZEXT416((uint)fVar1),
                                  ZEXT416((uint)pfVar29[lVar37]));
        pfVar29[lVar37] = auVar40._0_4_;
        auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar26[iVar35 + 5 + iVar24] *
                                                pfVar25[(long)iVar36 + lVar37 + 1])),
                                  ZEXT416((uint)fVar1),ZEXT416((uint)pfVar29[lVar37 + 1]));
        pfVar29[lVar37 + 1] = auVar40._0_4_;
        auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar26[iVar35 + 10 + iVar24] *
                                                pfVar25[(long)iVar36 + lVar37 + 2])),
                                  ZEXT416((uint)fVar1),ZEXT416((uint)pfVar29[lVar37 + 2]));
        pfVar29[lVar37 + 2] = auVar40._0_4_;
        auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar26[iVar24 + iVar35 + 0xf] *
                                                pfVar25[(long)iVar36 + lVar37 + 3])),
                                  ZEXT416((uint)fVar1),ZEXT416((uint)pfVar29[lVar37 + 3]));
        pfVar29[lVar37 + 3] = auVar40._0_4_;
      }
      iVar35 = iVar35 + 0x14;
      iVar36 = (int)lVar37 + iVar36 + iVar31 * 4;
    }
  }
  else {
    uVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    uVar23 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    pfVar29 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[childIndex];
    iVar31 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
    lVar37 = 0;
    iVar35 = 0;
    for (uVar34 = 0; uVar34 != (~((int)uVar23 >> 0x1f) & uVar23); uVar34 = uVar34 + 1) {
      lVar33 = (long)iVar35;
      fVar1 = pfVar26[lVar37];
      fVar2 = pfVar26[lVar37 + 1];
      fVar3 = pfVar26[lVar37 + 2];
      fVar4 = pfVar26[lVar37 + 3];
      fVar5 = pfVar26[lVar37 + 5];
      fVar6 = pfVar26[lVar37 + 6];
      fVar7 = pfVar26[lVar37 + 7];
      fVar8 = pfVar26[lVar37 + 8];
      fVar9 = pfVar26[lVar37 + 10];
      fVar10 = pfVar26[lVar37 + 0xb];
      fVar11 = pfVar26[lVar37 + 0xc];
      fVar12 = pfVar26[lVar37 + 0xd];
      fVar13 = pfVar26[lVar37 + 0xf];
      fVar14 = pfVar26[lVar37 + 0x10];
      fVar15 = pfVar26[lVar37 + 0x11];
      fVar16 = pfVar26[lVar37 + 0x12];
      pfVar30 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      fVar17 = pfVar27[uVar34];
      lVar38 = 0xc;
      uVar32 = ~((int)uVar22 >> 0x1f) & uVar22;
      while (bVar39 = uVar32 != 0, uVar32 = uVar32 - 1, bVar39) {
        uVar18 = *(uint *)((long)pfVar29 + lVar38 + lVar33 * 4 + -8);
        uVar19 = *(uint *)((long)pfVar29 + lVar38 + lVar33 * 4 + -0xc);
        uVar20 = *(uint *)((long)pfVar29 + lVar38 + lVar33 * 4 + -4);
        uVar21 = *(uint *)((long)pfVar29 + lVar38 + lVar33 * 4);
        auVar40 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(uVar18));
        auVar41 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416(uVar18));
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416(uVar18));
        auVar43 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416(uVar18));
        auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar1),ZEXT416(uVar19));
        auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar5),ZEXT416(uVar19));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar9),ZEXT416(uVar19));
        auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar13),ZEXT416(uVar19));
        auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar3),ZEXT416(uVar20));
        auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar7),ZEXT416(uVar20));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar11),ZEXT416(uVar20));
        auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar15),ZEXT416(uVar20));
        auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar4),ZEXT416(uVar21));
        auVar40 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)pfVar25 +
                                                          lVar38 + lVar33 * 4 + -0xc)));
        auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar8),ZEXT416(uVar21));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar12),ZEXT416(uVar21));
        auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar16),ZEXT416(uVar21));
        auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar17),
                                      ZEXT416(*(uint *)((long)pfVar30 + lVar38 + -0xc)));
        *(int *)((long)pfVar30 + lVar38 + -0xc) = auVar40._0_4_;
        auVar40 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)pfVar25 + lVar38 + lVar33 * 4 + -8)
                                                ));
        auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar17),
                                      ZEXT416(*(uint *)((long)pfVar30 + lVar38 + -8)));
        *(int *)((long)pfVar30 + lVar38 + -8) = auVar40._0_4_;
        auVar40 = vmulss_avx512f(auVar42,ZEXT416(*(uint *)((long)pfVar25 + lVar38 + lVar33 * 4 + -4)
                                                ));
        auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar17),
                                      ZEXT416(*(uint *)((long)pfVar30 + lVar38 + -4)));
        *(int *)((long)pfVar30 + lVar38 + -4) = auVar40._0_4_;
        auVar40 = vmulss_avx512f(auVar43,ZEXT416(*(uint *)((long)pfVar25 + lVar38 + lVar33 * 4)));
        auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar17),
                                      ZEXT416(*(uint *)((long)pfVar30 + lVar38)));
        *(int *)((long)pfVar30 + lVar38) = auVar40._0_4_;
        lVar38 = lVar38 + 0x10;
      }
      lVar37 = lVar37 + 0x14;
      iVar35 = iVar35 + iVar31 * 4;
    }
  }
  iVar31 = integrateOutStatesAndScale
                     (this,(this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp,
                      stateFrequenciesIndex,scalingFactorsIndex,outSumLogLikelihood);
  return iVar31;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}